

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

ssize_t __thiscall Button::read(Button *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  size_t __nbytes_00;
  size_t __nbytes_01;
  size_t __nbytes_02;
  size_t __nbytes_03;
  size_t __nbytes_04;
  void *__buf_00;
  undefined4 in_register_00000034;
  uint8_t *puVar4;
  uint8_t *puVar5;
  
  iVar1 = Util::readBool((uint8_t *)CONCAT44(in_register_00000034,__fd),&this->isTextButton);
  puVar5 = (uint8_t *)CONCAT44(in_register_00000034,__fd) + iVar1;
  iVar1 = Util::readBool(puVar5,&this->isCustomBackground);
  puVar5 = puVar5 + iVar1;
  iVar1 = Util::readString(puVar5,&this->text);
  puVar4 = puVar5 + iVar1;
  Color::read((int)puVar4,&this->textColor,__nbytes_00);
  sVar3 = FontData::read(iVar1 + (int)puVar5 + 0x10,&this->textFont,__nbytes_01);
  iVar1 = Util::readInt32(puVar4 + (long)(int)sVar3 + 0x10,&this->textTrimming);
  puVar5 = puVar4 + (long)(int)sVar3 + 0x10 + iVar1;
  iVar1 = Util::readBool(puVar5,&this->hasTextShadow);
  puVar4 = puVar5 + iVar1;
  TextShadow::read((int)puVar4,&this->textShadow,__nbytes_02);
  NinePatchMargin::read(iVar1 + (int)puVar5 + 0x18,&this->margin,__nbytes_03);
  iVar1 = Util::readString(puVar5 + (long)iVar1 + 0x28,&this->backgroundNormalImage);
  puVar4 = puVar4 + (long)iVar1 + 0x28;
  iVar1 = Util::readString(puVar4,&this->backgroundPressedImage);
  puVar4 = puVar4 + iVar1;
  iVar1 = Util::readString(puVar4,&this->backgroundDisabledImage);
  iVar2 = Util::readString(puVar4 + iVar1,&this->iconImage);
  iVar1 = (int)(puVar4 + iVar1);
  Color::read(iVar1 + iVar2,&this->backgroundFilter,__nbytes_04);
  sVar3 = Widget::read(&this->super_Widget,iVar2 + iVar1 + 0x10,__buf_00,__nbytes);
  return sVar3;
}

Assistant:

uint8_t* Button::read(uint8_t* buf)
{
	buf += Util::readBool(buf, isTextButton);
	buf += Util::readBool(buf, isCustomBackground);
	buf += Util::readString(buf, text);
	
	buf += Color::read(buf, textColor);
	buf += FontData::read(buf, textFont);
	buf += Util::readInt32(buf, textTrimming);
	buf += Util::readBool(buf, hasTextShadow);
	buf += TextShadow::read(buf, textShadow);
	buf += NinePatchMargin::read(buf, margin);
	
	buf += Util::readString(buf, backgroundNormalImage);
	buf += Util::readString(buf, backgroundPressedImage);
	buf += Util::readString(buf, backgroundDisabledImage);

	buf += Util::readString(buf, iconImage);

	buf += Color::read(buf, backgroundFilter);
	buf = Widget::read(buf);

	return buf;
}